

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

BranchLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BranchLayerParams>
          (Arena *arena)

{
  BranchLayerParams *pBVar1;
  
  if (arena != (Arena *)0x0) {
    pBVar1 = DoCreateMessage<CoreML::Specification::BranchLayerParams>(arena);
    return pBVar1;
  }
  pBVar1 = (BranchLayerParams *)operator_new(0x28);
  CoreML::Specification::BranchLayerParams::BranchLayerParams(pBVar1,(Arena *)0x0,false);
  return pBVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }